

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

void __thiscall LinearSystem::LinearSystem(LinearSystem *this,ExtendedMatrix *system,Mode mode)

{
  int iVar1;
  Matrix *pMVar2;
  Mode mode_local;
  ExtendedMatrix *system_local;
  LinearSystem *this_local;
  
  this->mode_ = mode;
  pMVar2 = ExtendedMatrix::GetMainMatrix(system);
  iVar1 = Matrix::GetNumRows(pMVar2);
  this->n_ = iVar1;
  pMVar2 = ExtendedMatrix::GetMainMatrix(system);
  iVar1 = Matrix::GetNumColumns(pMVar2);
  this->m_ = iVar1;
  this->rank_ = -1;
  ExtendedMatrix::ExtendedMatrix(&this->start_system_,system);
  ExtendedMatrix::ExtendedMatrix(&this->system_,system);
  memset(&this->history_,0,0x18);
  std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::vector
            (&this->history_);
  return;
}

Assistant:

LinearSystem::LinearSystem(const ExtendedMatrix& system, Mode mode)
    : mode_(mode),
      n_(system.GetMainMatrix().GetNumRows()),
      m_(system.GetMainMatrix().GetNumColumns()),
      rank_(-1),
      start_system_(system),
      system_(system),
      history_() {}